

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcUtil.c
# Opt level: O0

int Abc_NtkLogicMakeSimpleCos2(Abc_Ntk_t *pNtk,int fDuplicate)

{
  Abc_Obj_t *__s1;
  int iVar1;
  Abc_Obj_t *pAVar2;
  Abc_Obj_t *pObj;
  char *pcVar3;
  char *__s2;
  int local_30;
  int local_2c;
  int nDupGates;
  int i;
  Abc_Obj_t *pDriver;
  Abc_Obj_t *pNode;
  int fDuplicate_local;
  Abc_Ntk_t *pNtk_local;
  
  local_30 = 0;
  iVar1 = Abc_NtkIsLogic(pNtk);
  if (iVar1 == 0) {
    __assert_fail("Abc_NtkIsLogic(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcUtil.c"
                  ,0x3de,"int Abc_NtkLogicMakeSimpleCos2(Abc_Ntk_t *, int)");
  }
  Abc_NtkIncrementTravId(pNtk);
  local_2c = 0;
  do {
    iVar1 = Abc_NtkCoNum(pNtk);
    if (iVar1 <= local_2c) {
      iVar1 = Abc_NtkLogicHasSimpleCos(pNtk);
      if (iVar1 != 0) {
        return local_30;
      }
      __assert_fail("Abc_NtkLogicHasSimpleCos(pNtk)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcUtil.c"
                    ,0x400,"int Abc_NtkLogicMakeSimpleCos2(Abc_Ntk_t *, int)");
    }
    pAVar2 = Abc_NtkCo(pNtk,local_2c);
    pObj = Abc_ObjFanin0(pAVar2);
    iVar1 = Abc_ObjFaninC0(pAVar2);
    if (iVar1 == 0) {
      iVar1 = Abc_ObjIsCi(pObj);
      if (iVar1 != 0) {
        pcVar3 = Abc_ObjName(pObj);
        __s2 = Abc_ObjName(pAVar2);
        iVar1 = strcmp(pcVar3,__s2);
        if (iVar1 != 0) {
          Abc_NtkFixCoDriverProblem(pObj,pAVar2,fDuplicate);
          local_30 = local_30 + 1;
          goto LAB_00b222ec;
        }
      }
      iVar1 = Abc_NodeIsTravIdCurrent(pObj);
      if (iVar1 == 0) {
        pAVar2 = (Abc_Obj_t *)Abc_ObjName(pAVar2);
        pObj->pNext = pAVar2;
        Abc_NodeSetTravIdCurrent(pObj);
      }
      else {
        __s1 = pObj->pNext;
        pcVar3 = Abc_ObjName(pAVar2);
        iVar1 = strcmp((char *)__s1,pcVar3);
        if (iVar1 != 0) {
          Abc_NtkFixCoDriverProblem(pObj,pAVar2,fDuplicate);
          local_30 = local_30 + 1;
        }
      }
    }
    else {
      Abc_NtkFixCoDriverProblem(pObj,pAVar2,fDuplicate);
      local_30 = local_30 + 1;
    }
LAB_00b222ec:
    local_2c = local_2c + 1;
  } while( true );
}

Assistant:

int Abc_NtkLogicMakeSimpleCos2( Abc_Ntk_t * pNtk, int fDuplicate )
{
    Abc_Obj_t * pNode, * pDriver;
    int i, nDupGates = 0;
    assert( Abc_NtkIsLogic(pNtk) );
    Abc_NtkIncrementTravId( pNtk );
    Abc_NtkForEachCo( pNtk, pNode, i ) 
    {
        // if the driver is complemented, this is an error
        pDriver = Abc_ObjFanin0(pNode);
        if ( Abc_ObjFaninC0(pNode) )
        {
            Abc_NtkFixCoDriverProblem( pDriver, pNode, fDuplicate );
            nDupGates++;
            continue;
        }
        // if the driver is a CI and has different name, this is an error
        if ( Abc_ObjIsCi(pDriver) && strcmp(Abc_ObjName(pDriver), Abc_ObjName(pNode)) )
        {
            Abc_NtkFixCoDriverProblem( pDriver, pNode, fDuplicate );
            nDupGates++;
            continue;
        }
        // if the driver is visited for the first time, remember the CO name
        if ( !Abc_NodeIsTravIdCurrent(pDriver) )
        {
            pDriver->pNext = (Abc_Obj_t *)Abc_ObjName(pNode);
            Abc_NodeSetTravIdCurrent(pDriver);
            continue;
        }
        // the driver has second CO - if they have different name, this is an error
        if ( strcmp((char *)pDriver->pNext, Abc_ObjName(pNode)) ) // diff names
        {
            Abc_NtkFixCoDriverProblem( pDriver, pNode, fDuplicate );
            nDupGates++;
            continue;
        }
    }
    assert( Abc_NtkLogicHasSimpleCos(pNtk) );
    return nDupGates;
}